

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

bool __thiscall
xscript::parser::ast::parse_token
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *puVar1;
  
  puVar1 = ast_node::add_child((parent->_M_t).
                               super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                               .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                               _M_head_impl,TOKEN);
  ast_node::set_token((puVar1->_M_t).
                      super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                      .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>._M_head_impl,
                      this->cur_token);
  next(this);
  return true;
}

Assistant:

bool ast::parse_token(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(TOKEN);

    node->set_token(cur_token);
    next();

    return true;
}